

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialog::setSizeGripEnabled(QDialog *this,bool enabled)

{
  byte bVar1;
  bool bVar2;
  QDialogPrivate *p;
  QWidget *this_00;
  byte in_SIL;
  int __sig;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QDialogPrivate *d;
  QRect *in_stack_ffffffffffffff38;
  QPoint *in_stack_ffffffffffffff48;
  QPoint *p2;
  QWidget *in_stack_ffffffffffffff58;
  QWidget *this_01;
  undefined7 in_stack_ffffffffffffff70;
  QWidget *this_02;
  QPoint local_50;
  QRect local_48;
  QPoint local_38;
  QRect local_30;
  QPoint local_20;
  QPoint local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  this_02 = in_RDI;
  p = d_func((QDialog *)0x745d49);
  p->sizeGripEnabled = (bool)(bVar1 & 1);
  if ((((bVar1 & 1) == 0) || ((p->doShowExtension & 1U) == 0)) &&
     ((bool)((bVar1 ^ 0xff) & 1) != (p->resizer == (QSizeGrip *)0x0))) {
    if ((bVar1 & 1) == 0) {
      if (p->resizer != (QSizeGrip *)0x0) {
        (**(code **)(*(long *)&p->resizer->super_QWidget + 0x20))();
      }
      p->resizer = (QSizeGrip *)0x0;
    }
    else {
      this_00 = (QWidget *)operator_new(0x28);
      QSizeGrip::QSizeGrip((QSizeGrip *)in_RDI,in_stack_ffffffffffffff58);
      p->resizer = (QSizeGrip *)this_00;
      this_01 = &p->resizer->super_QWidget;
      local_10 = (**(code **)(*(long *)&p->resizer->super_QWidget + 0x70))();
      QWidget::resize(this_02,(QSize *)CONCAT17(bVar1,in_stack_ffffffffffffff70));
      bVar2 = QWidget::isRightToLeft((QWidget *)0x745e25);
      if (bVar2) {
        p2 = (QPoint *)p->resizer;
        local_30 = QWidget::rect(this_01);
        local_20 = QRect::bottomLeft(in_stack_ffffffffffffff38);
        local_48 = QWidget::rect(this_01);
        local_38 = QRect::bottomLeft(in_stack_ffffffffffffff38);
        local_18 = ::operator-((QPoint *)this_00,p2);
        __sig = (int)&local_18;
        QWidget::move((QWidget *)CONCAT17(bVar1,in_stack_ffffffffffffff70),(QPoint *)p);
      }
      else {
        QWidget::rect(this_01);
        QRect::bottomRight(in_stack_ffffffffffffff38);
        QWidget::rect(this_01);
        QRect::bottomRight(in_stack_ffffffffffffff38);
        local_50 = ::operator-((QPoint *)this_00,in_stack_ffffffffffffff48);
        __sig = (int)&local_50;
        QWidget::move((QWidget *)CONCAT17(bVar1,in_stack_ffffffffffffff70),(QPoint *)p);
      }
      QWidget::raise(&p->resizer->super_QWidget,__sig);
      QWidget::show(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialog::setSizeGripEnabled(bool enabled)
{
#if !QT_CONFIG(sizegrip)
    Q_UNUSED(enabled);
#else
    Q_D(QDialog);
#if QT_CONFIG(sizegrip)
    d->sizeGripEnabled = enabled;
    if (enabled && d->doShowExtension)
        return;
#endif
    if (!enabled != !d->resizer) {
        if (enabled) {
            d->resizer = new QSizeGrip(this);
            // adjustSize() processes all events, which is suboptimal
            d->resizer->resize(d->resizer->sizeHint());
            if (isRightToLeft())
                d->resizer->move(rect().bottomLeft() -d->resizer->rect().bottomLeft());
            else
                d->resizer->move(rect().bottomRight() -d->resizer->rect().bottomRight());
            d->resizer->raise();
            d->resizer->show();
        } else {
            delete d->resizer;
            d->resizer = nullptr;
        }
    }
#endif // QT_CONFIG(sizegrip)
}